

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::make_loo_norm(quadratic_cost_type<double> *this,int n)

{
  undefined1 auVar1 [16];
  quad *pqVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  pdVar3 = std::__max_element<double*,__gnu_cxx::__ops::_Iter_less_iter>();
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *pdVar3;
  lVar4 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n] << 4;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 0x10) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)((long)&((this->quadratic_elements)._M_t.
                                      super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>
                                     ._M_head_impl)->factor + lVar5);
    auVar8 = vmaxsd_avx(auVar8,auVar1);
  }
  dVar7 = auVar8._0_8_;
  if ((uint)((long)ABS(dVar7) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    pdVar3 = (this->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    for (uVar6 = 0; (uint)n != uVar6; uVar6 = uVar6 + 1) {
      pdVar3[uVar6] = pdVar3[uVar6] / dVar7;
    }
    pqVar2 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<double>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<double>::quad_*,_false>.
             _M_head_impl;
    for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 0x10) {
      *(double *)((long)&pqVar2->factor + lVar5) =
           *(double *)((long)&pqVar2->factor + lVar5) / dVar7;
    }
  }
  return;
}

Assistant:

void make_loo_norm(int n)
    {
        Float div =
          *std::max_element(linear_elements.get(), linear_elements.get() + n);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div = std::max(quadratic_elements[i].factor, div);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }